

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O0

regexp_flag __thiscall mjs::regexp_flags_from_string(mjs *this,wstring_view s)

{
  uint uVar1;
  char ch_00;
  regexp_flag r;
  regexp_flag rVar2;
  const_iterator pvVar3;
  ostream *poVar4;
  runtime_error *this_00;
  char *pcVar5;
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream oss;
  regexp_flag here;
  value_type ch;
  const_iterator __end1;
  const_iterator __begin1;
  wstring_view *__range1;
  undefined1 auStack_18 [4];
  regexp_flag f;
  wstring_view s_local;
  
  s_local._M_len = s._M_len;
  __range1._4_4_ = none;
  _auStack_18 = this;
  __end1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_18);
  pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_18);
  while( true ) {
    if (__end1 == pvVar3) {
      return __range1._4_4_;
    }
    uVar1 = *__end1;
    ch_00 = (char)uVar1;
    r = regexp_flag_from_char(ch_00);
    if (r == none) break;
    rVar2 = operator&(__range1._4_4_,r);
    if (rVar2 != none) break;
    __range1._4_4_ = operator|(__range1._4_4_,r);
    __end1 = __end1 + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  if ((uVar1 & 0xffff) < 0x80) {
    pcVar5 = "Duplicate";
    if (r == none) {
      pcVar5 = "Invalid";
    }
    poVar4 = std::operator<<((ostream *)local_1b8,pcVar5);
    poVar4 = std::operator<<(poVar4," flag \'");
    poVar4 = std::operator<<(poVar4,ch_00);
    std::operator<<(poVar4,"\' given to RegExp constructor");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this_00,local_1e8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __assert_fail("static_cast<char16_t>(ch) <= 0x7f",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp.cpp",
                0x28,"regexp_flag mjs::regexp_flags_from_string(std::wstring_view)");
}

Assistant:

regexp_flag regexp_flags_from_string(std::wstring_view s) {
    auto f = regexp_flag::none;
    for (const auto ch: s) {
        const regexp_flag here = regexp_flag_from_char(static_cast<char>(ch));
        if (here == regexp_flag::none || (f & here) != regexp_flag::none) {
            std::ostringstream oss;
            assert(static_cast<char16_t>(ch) <= 0x7f); // TODO: Report better...
            oss << (here == regexp_flag::none ? "Invalid" : "Duplicate") << " flag '" << static_cast<char>(ch) << "' given to RegExp constructor";
            throw std::runtime_error(oss.str());
        }
        f = f | here;
    }
    return f;
}